

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void gatom_clipfloat(t_gatom *x,t_atom *ap,t_float f)

{
  float local_1c;
  t_float f_local;
  t_atom *ap_local;
  t_gatom *x_local;
  
  local_1c = f;
  if ((((x->a_draglo != 0.0) || (NAN(x->a_draglo))) || (x->a_draghi != 0.0)) || (NAN(x->a_draghi)))
  {
    if (f < x->a_draglo) {
      local_1c = x->a_draglo;
    }
    if (x->a_draghi <= local_1c && local_1c != x->a_draghi) {
      local_1c = x->a_draghi;
    }
  }
  (ap->a_w).w_float = local_1c;
  gatom_senditup(x);
  gatom_bang(x);
  return;
}

Assistant:

static void gatom_clipfloat(t_gatom *x, t_atom *ap, t_float f)
{
    if (x->a_draglo != 0 || x->a_draghi != 0)
    {
        if (f < x->a_draglo)
            f = x->a_draglo;
        if (f > x->a_draghi)
            f = x->a_draghi;
    }
    ap->a_w.w_float = f;
    gatom_senditup(x);
    gatom_bang(x);
}